

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::DecodeString
          (string *__return_storage_ptr__,NumericCharacterEntity *this,string *s)

{
  size_type sVar1;
  char *pcVar2;
  ulong start;
  allocator<char> local_51;
  string local_50;
  
  sVar1 = s->_M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_51);
  }
  else {
    for (start = 0; sVar1 != start; start = start + 1) {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)s);
      if ((start < sVar1 - 3) && (*pcVar2 == '&')) {
        std::__cxx11::string::string((string *)&local_50,(string *)s);
        DecodeRemaining(__return_storage_ptr__,this,&local_50,start);
        std::__cxx11::string::~string((string *)&local_50);
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectFormatter::NumericCharacterEntity::DecodeString(std::string s)
{
    if (s.empty())
    {
        return "";
    }

    size_t length = s.length();

    for (size_t i = 0; i < length; i++)
    {
        char c = s.at(i);

        if (c == '&' && i < length - 3)
        {
            return DecodeRemaining(s, i);
        }
    }

    return s;
}